

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadDoubleVector
          (CrateReader *this,vector<double,_std::allocator<double>_> *d)

{
  void *__buf;
  pointer pdVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ssize_t sVar5;
  char *pcVar6;
  uint64_t n;
  ostringstream ss_e;
  ulong local_1b8 [5];
  ostringstream local_190 [376];
  
  bVar2 = StreamReader::read8(this->_sr,local_1b8);
  if (bVar2) {
    if (local_1b8[0] == 0) {
      pdVar1 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_finish == pdVar1) {
        return true;
      }
      (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar1;
      return true;
    }
    if ((this->_config).maxArrayElements < local_1b8[0]) {
      ::std::__cxx11::ostringstream::ostringstream(local_190);
      poVar3 = ::std::operator<<((ostream *)local_190,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadDoubleVector");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x311);
      ::std::operator<<(poVar3," ");
      pcVar6 = "Too many array elements.";
    }
    else {
      __buf = (void *)(local_1b8[0] * 8);
      uVar4 = this->_memoryUsage + (long)__buf;
      this->_memoryUsage = uVar4;
      if (uVar4 <= (this->_config).maxMemoryBudget) {
        ::std::vector<double,_std::allocator<double>_>::resize(d,local_1b8[0]);
        sVar5 = StreamReader::read(this->_sr,(int)__buf,__buf,
                                   (size_t)(d->super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start);
        if (sVar5 != 0) {
          return true;
        }
        goto LAB_0016f382;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_190);
      poVar3 = ::std::operator<<((ostream *)local_190,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadDoubleVector");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x314);
      ::std::operator<<(poVar3," ");
      pcVar6 = "Reached to max memory budget.";
    }
    poVar3 = ::std::operator<<((ostream *)local_190,pcVar6);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
LAB_0016f382:
    ::std::__cxx11::string::append((char *)&this->_err);
  }
  return false;
}

Assistant:

bool CrateReader::ReadDoubleVector(std::vector<double> *d) {
  size_t length;

  uint64_t n;
  if (!_sr->read8(&n)) {
    _err += "Failed to read the number of array elements.\n";
    return false;
  }

  length = size_t(n);

  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(length * sizeof(double));

  d->resize(length);

  // TODO(syoyo): Zero-copy
  if (!_sr->read(sizeof(double) * length, sizeof(double) * length,
                 reinterpret_cast<uint8_t *>(d->data()))) {
    _err += "Failed to read double vector data.\n";
    return false;
  }

  return true;
}